

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void boolean(ch_compilation *comp)

{
  ch_token_kind cVar1;
  undefined8 in_RAX;
  undefined8 in_RDX;
  ch_op *data_start;
  ch_op op_1;
  ch_op op;
  
  data_start = &op_1;
  cVar1 = (comp->previous).kind;
  if (cVar1 == TK_FALSE) {
    _op_1 = CONCAT44((ch_op)((ulong)in_RAX >> 0x20),0xd);
  }
  else {
    if (cVar1 != TK_TRUE) {
      error(comp,"Expected boolean expression",in_RDX,in_RAX);
      return;
    }
    data_start = &op;
    _op_1 = CONCAT44(0xe,(ch_op)in_RAX);
  }
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,data_start,1);
  return;
}

Assistant:

void boolean(ch_compilation* comp) {
  ch_token_kind kind = comp->previous.kind;

  switch(kind) {
    case TK_TRUE: 
      EMIT_OP(GET_EMIT(comp), OP_TRUE);
      return;
    case TK_FALSE: 
      EMIT_OP(GET_EMIT(comp), OP_FALSE);
      return;
    default:
      error(comp, "Expected boolean expression");
  }
}